

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O0

Boolean MA_init(Integer datatype,Integer nominal_stack,Integer nominal_heap)

{
  long lVar1;
  char *func;
  char *emsg;
  char *__size;
  char *pcVar2;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  ulongi total_bytes;
  ulongi stack_bytes;
  ulongi heap_bytes;
  char *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  size_t sVar3;
  Boolean local_8;
  
  ma_stats.calls[10] = ma_stats.calls[10] + 1;
  ma_preinitialize((char *)0x1d7cc1);
  if (ma_initialized == 0) {
    if ((in_RDI < 1000) || (0x3f8 < in_RDI)) {
      sprintf(ma_ebuf,"invalid datatype: %ld",in_RDI);
      ma_error((ErrorLevel)((ulong)in_RDX >> 0x20),(ErrorType)in_RDX,in_stack_ffffffffffffffd8,
               in_stack_ffffffffffffffd0);
      local_8 = 0;
    }
    else {
      lVar1 = in_RDI + -1000;
      if (in_RDX < 0) {
        sVar3 = 0x80000;
      }
      else {
        sVar3 = in_RDX * ma_sizeof[lVar1] + (long)(ma_sizeof[lVar1] + -1) + 0x5f;
      }
      func = (char *)mai_round(sVar3,8);
      if (in_RSI < 0) {
        sVar3 = 0x80000;
      }
      else {
        sVar3 = in_RSI * ma_sizeof[lVar1] + (long)(ma_sizeof[lVar1] + -1) + 0x5f;
      }
      emsg = (char *)mai_round(sVar3,8);
      __size = func + (long)emsg;
      pcVar2 = getenv("MA_USE_ARMCI_MEM");
      if (pcVar2 == (char *)0x0) {
        ma_segment = (Pointer)malloc((size_t)__size);
      }
      else {
        ma_segment = (Pointer)ARMCI_Malloc_local(0x1d7e6b);
      }
      if (ma_segment == (Pointer)0x0) {
        sprintf(ma_ebuf,"could not allocate %lu bytes",__size);
        ma_error((ErrorLevel)((ulong)in_RDX >> 0x20),(ErrorType)in_RDX,func,emsg);
        local_8 = 0;
      }
      else {
        ma_partition = ma_segment + (long)func;
        ma_sp = ma_segment + (long)__size;
        ma_hp = ma_segment;
        ma_hfree = (AD *)0x0;
        ma_hused = (AD *)0x0;
        ma_sused = (AD *)0x0;
        ma_initialized = 1;
        local_8 = 1;
        ma_eos = ma_sp;
      }
    }
  }
  else {
    sprintf(ma_ebuf,"MA already initialized");
    ma_error((ErrorLevel)((ulong)in_RDX >> 0x20),(ErrorType)in_RDX,in_stack_ffffffffffffffd8,
             in_stack_ffffffffffffffd0);
    local_8 = 0;
  }
  return local_8;
}

Assistant:

public Boolean MA_init(
    Integer    datatype,    /* for computing storage requirement */
    Integer    nominal_stack,    /* # of datatype elements desired for stack */
    Integer    nominal_heap     /* # of datatype elements desired for heap */)
{
    ulongi    heap_bytes;    /* # of bytes for heap */
    ulongi    stack_bytes;    /* # of bytes for stack */
    ulongi    total_bytes;    /* total # of bytes */

#ifdef STATS
    ma_stats.calls[(int)FID_MA_init]++;
#endif /* STATS */

#ifdef VERIFY
    if (ma_auto_verify && !MA_verify_allocator_stuff())
        return MA_FALSE;
#endif /* VERIFY */

    /* preinitialize if necessary */
    ma_preinitialize("MA_init");

    /* verify uninitialization */
    if (ma_initialized)
    {
        (void)sprintf(ma_ebuf,
            "MA already initialized");
        ma_error(EL_Nonfatal, ET_External, "MA_init", ma_ebuf);
        return MA_FALSE;
    }

    /* verify datatype */
    if (!mt_valid(datatype))
    {
        (void)sprintf(ma_ebuf,
            "invalid datatype: %ld",
            (size_t)datatype);
        ma_error(EL_Nonfatal, ET_External, "MA_init", ma_ebuf);
        return MA_FALSE;
    }

    /* convert datatype to internal (index-suitable) value */
    datatype = mt_import(datatype);

    /* compute # of bytes in heap */
    if (nominal_heap < 0)
    {
        heap_bytes = DEFAULT_TOTAL_HEAP;
    }
    else
    {
        heap_bytes = (nominal_heap * ma_sizeof[datatype]) +
            (DEFAULT_REQUESTS_HEAP * max_block_overhead(datatype));
    }
    heap_bytes = (size_t)mai_round((size_t)heap_bytes, (ulongi)ALIGNMENT);

    /* compute # of bytes in stack */
    if (nominal_stack < 0)
    {
        stack_bytes = DEFAULT_TOTAL_STACK;
    }
    else
    {
        stack_bytes = (nominal_stack * ma_sizeof[datatype]) +
            (DEFAULT_REQUESTS_STACK * max_block_overhead(datatype));
    }
    stack_bytes = (size_t)mai_round((size_t)stack_bytes, (ulongi)ALIGNMENT);

    /* segment consists of heap and stack */
    total_bytes = heap_bytes + stack_bytes;
#ifdef NOUSE_MMAP
#if HAVE_MALLOPT
    /* disable memory mapped malloc */
    mallopt(M_MMAP_MAX, 0);
    mallopt(M_TRIM_THRESHOLD, -1);
#endif
#endif
    /* allocate the segment of memory */
#ifdef ENABLE_CUDA_MEM
    if(getenv("MA_USE_CUDA_MEM"))
    {
        void * temp_ptr = NULL;
        int cuda_error = 0;                  // cudaSuccess 0
        unsigned int cuda_mem_flags = 0x01;  // cudaMemAttachGlobal 0x01
        cuda_error = cudaMallocManaged(&temp_ptr, total_bytes, cuda_mem_flags);
        if (cuda_error == 0) {
          ma_segment = temp_ptr;
        } else {
          ma_segment = NULL;
        }
    }
    else
#elif defined(ENABLE_ARMCI_MEM_OPTION)
    if(getenv("MA_USE_ARMCI_MEM"))
    {
        ma_segment = (Pointer)ARMCI_Malloc_local(total_bytes);
    }
    else
#endif
    {
        ma_segment = (Pointer)bytealloc(total_bytes);
    }
    if (ma_segment == (Pointer)NULL)
    {
        (void)sprintf(ma_ebuf,
            "could not allocate %lu bytes",
            total_bytes);
        ma_error(EL_Nonfatal, ET_External, "MA_init", ma_ebuf);
        return MA_FALSE;
    }

    /*
     * initialize management stuff
     */

    /* partition is at (first address past) end of heap */
    ma_partition = ma_segment + heap_bytes;
    /* compute (first address past) end of segment */
    ma_eos = ma_segment + total_bytes;
    /* ma_hp initially points at start of segment */
    ma_hp = ma_segment;
    /* ma_sp initially points at end of segment */
    ma_sp = ma_eos;

    /* lists are all initially empty */
    ma_hfree = (AD *)NULL;
    ma_hused = (AD *)NULL;
    ma_sused = (AD *)NULL;

    /* we are now initialized */
    ma_initialized = MA_TRUE;

    /* success */
    return MA_TRUE;
}